

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void WebPCopyPlane(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int width,int height)

{
  uint uVar1;
  
  if (0 < height) {
    uVar1 = height + 1;
    do {
      memcpy(dst,src,(long)width);
      src = src + src_stride;
      dst = dst + dst_stride;
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

void WebPCopyPlane(const uint8_t* src, int src_stride,
                   uint8_t* dst, int dst_stride, int width, int height) {
  assert(src != NULL && dst != NULL);
  assert(abs(src_stride) >= width && abs(dst_stride) >= width);
  while (height-- > 0) {
    memcpy(dst, src, width);
    src += src_stride;
    dst += dst_stride;
  }
}